

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

int Abc_NtkCompareAndSaveBest(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *local_20;
  char *pFileNameOut;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    if (Abc_NtkCompareAndSaveBest::ParsBest.pName != (char *)0x0) {
      free(Abc_NtkCompareAndSaveBest::ParsBest.pName);
      Abc_NtkCompareAndSaveBest::ParsBest.pName = (char *)0x0;
    }
    pNtk_local._4_4_ = 0;
  }
  else {
    iVar2 = Abc_NtkIsLogic(pNtk);
    if (iVar2 == 0) {
      pNtk_local._4_4_ = 0;
    }
    else {
      Abc_NtkCompareAndSaveBest::ParsNew.Depth = Abc_NtkLevel(pNtk);
      Abc_NtkCompareAndSaveBest::ParsNew.Flops = Abc_NtkLatchNum(pNtk);
      Abc_NtkCompareAndSaveBest::ParsNew.Nodes = Abc_NtkNodeNum(pNtk);
      Abc_NtkCompareAndSaveBest::ParsNew.Edges = Abc_NtkGetTotalFanins(pNtk);
      Abc_NtkCompareAndSaveBest::ParsNew.nPis = Abc_NtkPiNum(pNtk);
      Abc_NtkCompareAndSaveBest::ParsNew.nPos = Abc_NtkPoNum(pNtk);
      if (((((Abc_NtkCompareAndSaveBest::ParsBest.pName == (char *)0x0) ||
            (iVar2 = strcmp(Abc_NtkCompareAndSaveBest::ParsBest.pName,pNtk->pName), iVar2 != 0)) ||
           (Abc_NtkCompareAndSaveBest::ParsNew.Depth < Abc_NtkCompareAndSaveBest::ParsBest.Depth))
          || ((Abc_NtkCompareAndSaveBest::ParsBest.Depth == Abc_NtkCompareAndSaveBest::ParsNew.Depth
              && (Abc_NtkCompareAndSaveBest::ParsNew.Flops <
                  Abc_NtkCompareAndSaveBest::ParsBest.Flops)))) ||
         ((Abc_NtkCompareAndSaveBest::ParsBest.Depth == Abc_NtkCompareAndSaveBest::ParsNew.Depth &&
          ((Abc_NtkCompareAndSaveBest::ParsBest.Flops == Abc_NtkCompareAndSaveBest::ParsNew.Flops &&
           (Abc_NtkCompareAndSaveBest::ParsNew.Edges < Abc_NtkCompareAndSaveBest::ParsBest.Edges))))
         )) {
        if (Abc_NtkCompareAndSaveBest::ParsBest.pName != (char *)0x0) {
          free(Abc_NtkCompareAndSaveBest::ParsBest.pName);
          Abc_NtkCompareAndSaveBest::ParsBest.pName = (char *)0x0;
        }
        Abc_NtkCompareAndSaveBest::ParsBest.pName = Extra_UtilStrsav(pNtk->pName);
        Abc_NtkCompareAndSaveBest::ParsBest.Depth = Abc_NtkCompareAndSaveBest::ParsNew.Depth;
        Abc_NtkCompareAndSaveBest::ParsBest.Flops = Abc_NtkCompareAndSaveBest::ParsNew.Flops;
        Abc_NtkCompareAndSaveBest::ParsBest.Nodes = Abc_NtkCompareAndSaveBest::ParsNew.Nodes;
        Abc_NtkCompareAndSaveBest::ParsBest.Edges = Abc_NtkCompareAndSaveBest::ParsNew.Edges;
        Abc_NtkCompareAndSaveBest::ParsBest.nPis = Abc_NtkCompareAndSaveBest::ParsNew.nPis;
        Abc_NtkCompareAndSaveBest::ParsBest.nPos = Abc_NtkCompareAndSaveBest::ParsNew.nPos;
        pcVar1 = pNtk->pSpec;
        sVar3 = strlen(pNtk->pSpec);
        iVar2 = strcmp(pcVar1 + (sVar3 - 10),"_best.blif");
        if (iVar2 == 0) {
          local_20 = pNtk->pSpec;
        }
        else {
          local_20 = Extra_FileNameGenericAppend(pNtk->pSpec,"_best.blif");
        }
        Io_Write(pNtk,local_20,IO_FILE_BLIF);
        pNtk_local._4_4_ = 1;
      }
      else {
        pNtk_local._4_4_ = 0;
      }
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkCompareAndSaveBest( Abc_Ntk_t * pNtk )
{
    extern void Io_Write( Abc_Ntk_t * pNtk, char * pFileName, Io_FileType_t FileType );
    static struct ParStruct {
        char * pName;  // name of the best saved network
        int    Depth;  // depth of the best saved network
        int    Flops;  // flops in the best saved network 
        int    Nodes;  // nodes in the best saved network
        int    Edges;  // edges in the best saved network
        int    nPis;   // the number of primary inputs
        int    nPos;   // the number of primary outputs
    } ParsNew, ParsBest = { 0 };
    char * pFileNameOut;
    // free storage for the name
    if ( pNtk == NULL )
    {
        ABC_FREE( ParsBest.pName );
        return 0;
    }
    // quit if not a logic network
    if ( !Abc_NtkIsLogic(pNtk) )
        return 0;
    // get the parameters
    ParsNew.Depth = Abc_NtkLevel( pNtk );
    ParsNew.Flops = Abc_NtkLatchNum( pNtk );
    ParsNew.Nodes = Abc_NtkNodeNum( pNtk );
    ParsNew.Edges = Abc_NtkGetTotalFanins( pNtk );
    ParsNew.nPis  = Abc_NtkPiNum( pNtk );
    ParsNew.nPos  = Abc_NtkPoNum( pNtk );
    // reset the parameters if the network has the same name
    if (  ParsBest.pName == NULL ||
          strcmp(ParsBest.pName, pNtk->pName) ||
          ParsBest.Depth >  ParsNew.Depth ||
         (ParsBest.Depth == ParsNew.Depth && ParsBest.Flops >  ParsNew.Flops) ||
         (ParsBest.Depth == ParsNew.Depth && ParsBest.Flops == ParsNew.Flops && ParsBest.Edges >  ParsNew.Edges) )
    {
        ABC_FREE( ParsBest.pName );
        ParsBest.pName = Extra_UtilStrsav( pNtk->pName );
        ParsBest.Depth = ParsNew.Depth;
        ParsBest.Flops = ParsNew.Flops;
        ParsBest.Nodes = ParsNew.Nodes;
        ParsBest.Edges = ParsNew.Edges;
        ParsBest.nPis  = ParsNew.nPis;
        ParsBest.nPos  = ParsNew.nPos;
        // writ the network
        if ( strcmp(pNtk->pSpec + strlen(pNtk->pSpec) - strlen("_best.blif"), "_best.blif") )
            pFileNameOut = Extra_FileNameGenericAppend( pNtk->pSpec, "_best.blif" );
        else
            pFileNameOut = pNtk->pSpec;
        Io_Write( pNtk, pFileNameOut, IO_FILE_BLIF );
        return 1;
    }
    return 0;
}